

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sig_set_handler.c
# Opt level: O0

sig_handler_t * sig_set_handler(int signo,sig_handler_t *handler)

{
  int iVar1;
  _union_1457 local_150;
  sigaction old_act;
  sigaction act;
  sig_handler_t *handler_local;
  _union_1457 _Stack_10;
  int signo_local;
  
  old_act.sa_restorer = (_func_void *)handler;
  act.sa_restorer = (_func_void *)handler;
  sigemptyset((sigset_t *)&act);
  act.sa_mask.__val[0xf]._0_4_ = 0;
  iVar1 = sigaction(signo,(sigaction *)&old_act.sa_restorer,(sigaction *)&local_150);
  if (iVar1 < 0) {
    perror("sigaction");
    _Stack_10 = (_union_1457)0xffffffffffffffff;
  }
  else {
    _Stack_10 = local_150;
  }
  return (sig_handler_t *)_Stack_10.sa_handler;
}

Assistant:

sig_handler_t *sig_set_handler(int signo, sig_handler_t *handler) {
  struct sigaction act, old_act;

  act.sa_handler = handler;
  sigemptyset(&act.sa_mask);
  act.sa_flags = 0;

  if (sigaction(signo, &act, &old_act) < 0) {
    perror("sigaction");
    return SIG_ERR;
  }

  return old_act.sa_handler;
}